

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O3

void __thiscall denialofservice_tests::DoS_bantime::test_method(DoS_bantime *this)

{
  AddrMan *addrman_in;
  NetGroupManager *netgroupman;
  Options opts;
  path ban_file;
  long lVar1;
  char cVar2;
  ChainstateManager *this_00;
  CChainParams *params;
  CConnman *this_01;
  int64_t nMockTimeIn;
  iterator pvVar3;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  shared_ptr<Sock> sock;
  __single_object connman;
  __single_object banman;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock35;
  CNode dummyNode;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  undefined8 in_stack_fffffffffffffa40;
  CAddress *pCVar5;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  uint uVar6;
  undefined4 in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa54;
  undefined1 in_stack_fffffffffffffa58;
  undefined7 in_stack_fffffffffffffa59;
  CNodeOptions *in_stack_fffffffffffffa60;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  undefined1 local_538 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_530;
  undefined2 local_528;
  undefined2 uStack_526;
  undefined4 uStack_524;
  undefined4 uStack_520;
  undefined2 uStack_51c;
  undefined2 uStack_51a;
  undefined4 local_518;
  undefined1 local_510 [16];
  unique_ptr<BanMan,_std::default_delete<BanMan>_> local_500;
  assertion_result local_4f8;
  uint64_t local_4e0;
  undefined1 local_4d8;
  unique_lock<std::mutex> local_4d0;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [24];
  CAddress *local_488;
  pointer local_478;
  pointer local_470;
  CNode local_468;
  direct_or_indirect local_c0;
  undefined4 local_b0;
  _List_node_base *local_a8;
  undefined2 local_a0;
  direct_or_indirect local_98;
  uint local_88;
  _List_node_base *local_80;
  undefined2 local_78;
  undefined8 local_70;
  undefined8 local_68;
  path local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_4d0._M_device = &NetEventsInterface::g_msgproc_mutex.super_mutex;
  local_4d0._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_4d0);
  ArgsManager::GetDataDir
            ((path *)&local_60,
             &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
              super_BasicTestingSetup.m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_60,7,"banlist");
  std::filesystem::__cxx11::path::path((path *)&local_98.indirect_contents,&local_60);
  this_00 = (ChainstateManager *)operator_new(0xf0);
  std::filesystem::__cxx11::path::path((path *)&local_468,(path *)&local_98.indirect_contents);
  ban_file.super_path._M_pathname._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffa3c;
  ban_file.super_path._M_pathname._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffa38;
  ban_file.super_path._M_pathname._M_string_length = in_stack_fffffffffffffa40;
  ban_file.super_path._M_pathname.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa48;
  ban_file.super_path._M_pathname.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa4c;
  ban_file.super_path._M_pathname.field_2._8_4_ = in_stack_fffffffffffffa50;
  ban_file.super_path._M_pathname.field_2._12_4_ = in_stack_fffffffffffffa54;
  ban_file.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._0_1_ =
       in_stack_fffffffffffffa58;
  ban_file.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._1_7_ =
       in_stack_fffffffffffffa59;
  BanMan::BanMan((BanMan *)this_00,ban_file,(CClientUIInterface *)&local_468,0);
  local_500._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<BanMan,_std::default_delete<BanMan>,_true,_true>)
       (__uniq_ptr_data<BanMan,_std::default_delete<BanMan>,_true,_true>)this_00;
  std::filesystem::__cxx11::path::~path((path *)&local_468);
  std::filesystem::__cxx11::path::~path((path *)&local_98.indirect_contents);
  std::filesystem::__cxx11::path::~path(&local_60);
  addrman_in = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.addrman._M_t.
               super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
               super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
               super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  netgroupman = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                super_BasicTestingSetup.m_node.netgroupman._M_t.
                super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
                .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl;
  params = Params();
  this_01 = (CConnman *)operator_new(0x488);
  CConnman::CConnman(this_01,0x1337,0x1337,addrman_in,netgroupman,params,true);
  local_528 = 0;
  uStack_524 = 100;
  uStack_520 = 100;
  uStack_51c = 0;
  local_518 = 2000;
  lVar1 = (ulong)CONCAT42(100,uStack_526) << 0x10;
  uVar6 = (uint)(CONCAT26(uStack_51a,100) >> 0x20);
  opts.max_extra_txs = (int)lVar1;
  opts.capture_messages = (bool)(char)((ulong)lVar1 >> 0x20);
  opts.deterministic_rng = (bool)(char)((ulong)lVar1 >> 0x28);
  opts._14_2_ = (short)((ulong)lVar1 >> 0x30);
  opts._0_8_ = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
               super_BasicTestingSetup.m_node.warnings._M_t.
               super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
               super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
               super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl;
  opts.max_headers_result = 100;
  local_510._8_8_ = this_01;
  PeerManager::make((CConnman *)local_510,(AddrMan *)this_01,
                    (BanMan *)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.addrman._M_t.
                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (ChainstateManager *)
                    local_500._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                    super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                    super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,
                    (CTxMemPool *)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.chainman._M_t.
                    super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                    .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
                    (Warnings *)
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                    super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,opts);
  BanMan::ClearBanned((BanMan *)
                      local_500._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>.
                      _M_t.super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                      super__Head_base<0UL,_BanMan_*,_false>._M_head_impl);
  nMockTimeIn = GetTime();
  SetMockTime(nMockTimeIn);
  ip((CService *)&local_c0.indirect_contents,0xa0b0c001);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_c0.indirect_contents);
  local_80 = local_a8;
  local_78 = local_a0;
  local_70 = 100000000;
  local_68 = 0;
  if (0x10 < (uint)local_b0) {
    free(local_c0.indirect_contents.indirect);
    local_c0.indirect_contents.indirect = (char *)0x0;
  }
  local_538 = (undefined1  [8])0x0;
  p_Stack_530 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CService::CService((CService *)local_4a0);
  local_478 = (pointer)0x5f5e100;
  local_470 = (pointer)0x0;
  local_4c0._0_8_ = local_4c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0);
  local_4f8._0_4_ = 0;
  local_4f8.m_message.px = (element_type *)0x0;
  local_4f8.m_message.pn.pi_ = local_4f8.m_message.pn.pi_ & 0xffffffffffffff00;
  local_4e0 = 5000000;
  local_4d8 = 0;
  pvVar3 = (iterator)0x4;
  pvVar4 = (iterator)0x4;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_98;
  sock.super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_538;
  pCVar5 = (CAddress *)local_4c0;
  CNode::CNode(&local_468,0,sock,(CAddress *)0x4,4,(uint64_t)local_4a0,(CAddress *)local_4c0,
               (string *)((ulong)uVar6 << 0x20),INBOUND,SUB81(&local_4f8,0),
               in_stack_fffffffffffffa60);
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::~unique_ptr
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             &local_4f8.m_message);
  if ((undefined1 *)local_4c0._0_8_ != local_4c0 + 0x10) {
    operator_delete((void *)local_4c0._0_8_,
                    (ulong)((long)&((NetPermissions *)local_4c0._16_8_)->m_flags + 1));
  }
  if (0x10 < (uint)local_4a0._16_4_) {
    free((void *)local_4a0._0_8_);
  }
  if (p_Stack_530 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_530);
  }
  LOCK();
  local_468.m_greatest_common_version.super___atomic_base<int>._M_i = (__atomic_base<int>)0x11180;
  UNLOCK();
  (*(code *)**(undefined8 **)(local_510._0_8_ + 8))((long *)(local_510._0_8_ + 8),&local_468,1);
  LOCK();
  local_468.fSuccessfullyConnected._M_base._M_i = (__atomic_base<bool>)true;
  UNLOCK();
  (**(code **)(*(long *)local_510._0_8_ + 0x98))(local_510._0_8_,local_468.id);
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1ac;
  file.m_begin = (iterator)&local_548;
  msg.m_end = pvVar4;
  msg.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_558,msg);
  cVar2 = (**(code **)(*(long *)(local_510._0_8_ + 8) + 0x20))
                    ((long *)(local_510._0_8_ + 8),&local_468);
  local_4f8.m_message.px = (element_type *)0x0;
  local_4f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4c0._0_8_ = "peerLogic->SendMessages(&dummyNode)";
  local_4c0._8_8_ = (long)"peerLogic->SendMessages(&dummyNode)" + 0x23;
  local_4a0[8] = '\0';
  local_4a0._0_8_ = &PTR__lazy_ostream_01389048;
  local_4a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_560 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_488 = (CAddress *)local_4c0;
  local_4f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)cVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_4f8,(lazy_ostream *)local_4a0,1,0,WARN,(check_type)pCVar5,(size_t)&local_568,
             0x1ac);
  boost::detail::shared_count::~shared_count(&local_4f8.m_message.pn);
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1ad;
  file_00.m_begin = (iterator)&local_578;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_588,
             msg_00);
  local_4f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       BanMan::IsDiscouraged
                 ((BanMan *)
                  local_500._M_t.super___uniq_ptr_impl<BanMan,_std::default_delete<BanMan>_>._M_t.
                  super__Tuple_impl<0UL,_BanMan_*,_std::default_delete<BanMan>_>.
                  super__Head_base<0UL,_BanMan_*,_false>._M_head_impl,
                  (CNetAddr *)&local_98.indirect_contents);
  local_4f8.m_message.px = (element_type *)0x0;
  local_4f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_4c0._0_8_ = "banman->IsDiscouraged(addr)";
  local_4c0._8_8_ = (long)"banman->IsDiscouraged(addr)" + 0x1b;
  local_4a0[8] = '\0';
  local_4a0._0_8_ = &PTR__lazy_ostream_01389048;
  local_4a0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/denialofservice_tests.cpp"
  ;
  local_590 = "";
  local_488 = (CAddress *)local_4c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_4f8,(lazy_ostream *)local_4a0,1,0,WARN,(check_type)pCVar5,(size_t)&local_598,
             0x1ad);
  boost::detail::shared_count::~shared_count(&local_4f8.m_message.pn);
  (**(code **)(*(long *)(local_510._0_8_ + 8) + 8))((long *)(local_510._0_8_ + 8),&local_468);
  CNode::~CNode(&local_468);
  if (0x10 < local_88) {
    free(local_98.indirect_contents.indirect);
  }
  if ((long *)local_510._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_510._0_8_ + 0x58))();
  }
  std::unique_ptr<CConnman,_std::default_delete<CConnman>_>::~unique_ptr
            ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)(local_510 + 8));
  std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::~unique_ptr(&local_500);
  std::unique_lock<std::mutex>::~unique_lock(&local_4d0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(DoS_bantime)
{
    LOCK(NetEventsInterface::g_msgproc_mutex);

    auto banman = std::make_unique<BanMan>(m_args.GetDataDirBase() / "banlist", nullptr, DEFAULT_MISBEHAVING_BANTIME);
    auto connman = std::make_unique<CConnman>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerLogic = PeerManager::make(*connman, *m_node.addrman, banman.get(), *m_node.chainman, *m_node.mempool, *m_node.warnings, {});

    banman->ClearBanned();
    int64_t nStartTime = GetTime();
    SetMockTime(nStartTime); // Overrides future calls to GetTime()

    CAddress addr(ip(0xa0b0c001), NODE_NONE);
    NodeId id{0};
    CNode dummyNode{id++,
                    /*sock=*/nullptr,
                    addr,
                    /*nKeyedNetGroupIn=*/4,
                    /*nLocalHostNonceIn=*/4,
                    CAddress(),
                    /*addrNameIn=*/"",
                    ConnectionType::INBOUND,
                    /*inbound_onion=*/false};
    dummyNode.SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(dummyNode, NODE_NETWORK);
    dummyNode.fSuccessfullyConnected = true;

    peerLogic->UnitTestMisbehaving(dummyNode.GetId());
    BOOST_CHECK(peerLogic->SendMessages(&dummyNode));
    BOOST_CHECK(banman->IsDiscouraged(addr));

    peerLogic->FinalizeNode(dummyNode);
}